

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recall_tree.cc
# Opt level: O2

base_learner * recall_tree_setup(options_i *options,vw *all)

{
  _Head_base<0UL,_recall_tree_ns::recall_tree_*,_false> _Var1;
  int iVar2;
  uint uVar3;
  option_group_definition *poVar4;
  typed_option<float> *ptVar5;
  ulong uVar6;
  ostream *poVar7;
  base_learner *l;
  single_learner *base;
  learner<recall_tree_ns::recall_tree,_example> *plVar8;
  char *pcVar9;
  __type_conflict _Var10;
  double dVar11;
  free_ptr<recall_tree_ns::recall_tree> tree;
  option_group_definition new_options;
  free_ptr<recall_tree_ns::recall_tree> local_9a0;
  allocator local_98c;
  allocator local_98b;
  allocator local_98a;
  allocator local_989;
  allocator local_988;
  allocator local_987;
  allocator local_986;
  allocator local_985;
  allocator local_984;
  allocator local_983;
  allocator local_982;
  allocator local_981;
  string local_980 [32];
  string local_960;
  string local_940 [32];
  string local_920;
  string local_900 [32];
  string local_8e0;
  string local_8c0 [32];
  string local_8a0;
  string local_880 [32];
  string local_860;
  string local_840 [32];
  string local_820;
  string local_800;
  undefined1 local_7e0 [112];
  bool local_770;
  option_group_definition local_740;
  undefined1 local_708 [112];
  bool local_698;
  undefined1 local_668 [112];
  bool local_5f8;
  undefined1 local_5c8 [112];
  bool local_558;
  undefined1 local_528 [112];
  bool local_4b8;
  typed_option<bool> local_488;
  typed_option<bool> local_3e8;
  typed_option<unsigned_long> local_348;
  typed_option<float> local_2a8;
  typed_option<float> local_208;
  typed_option<unsigned_long> local_168;
  typed_option<unsigned_int> local_c8;
  
  scoped_calloc_or_throw<recall_tree_ns::recall_tree>();
  std::__cxx11::string::string((string *)&local_800,"Recall Tree",(allocator *)local_7e0);
  VW::config::option_group_definition::option_group_definition(&local_740,&local_800);
  std::__cxx11::string::~string((string *)&local_800);
  std::__cxx11::string::string((string *)&local_820,"recall_tree",&local_981);
  VW::config::typed_option<unsigned_int>::typed_option
            ((typed_option<unsigned_int> *)local_7e0,&local_820,
             &(local_9a0._M_t.super___uniq_ptr_impl<recall_tree_ns::recall_tree,_void_(*)(void_*)>.
               _M_t.super__Tuple_impl<0UL,_recall_tree_ns::recall_tree_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_recall_tree_ns::recall_tree_*,_false>._M_head_impl)->k);
  local_770 = true;
  std::__cxx11::string::string(local_840,"Use online tree for multiclass",&local_982);
  std::__cxx11::string::_M_assign((string *)(local_7e0 + 0x30));
  VW::config::typed_option<unsigned_int>::typed_option
            (&local_c8,(typed_option<unsigned_int> *)local_7e0);
  poVar4 = VW::config::option_group_definition::add<unsigned_int>(&local_740,&local_c8);
  std::__cxx11::string::string((string *)&local_860,"max_candidates",&local_983);
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)local_708,&local_860,
             &(local_9a0._M_t.super___uniq_ptr_impl<recall_tree_ns::recall_tree,_void_(*)(void_*)>.
               _M_t.super__Tuple_impl<0UL,_recall_tree_ns::recall_tree_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_recall_tree_ns::recall_tree_*,_false>._M_head_impl)->
              max_candidates);
  local_698 = true;
  std::__cxx11::string::string(local_880,"maximum number of labels per leaf in the tree",&local_984)
  ;
  std::__cxx11::string::_M_assign((string *)(local_708 + 0x30));
  VW::config::typed_option<unsigned_long>::typed_option
            (&local_168,(typed_option<unsigned_long> *)local_708);
  poVar4 = VW::config::option_group_definition::add<unsigned_long>(poVar4,&local_168);
  std::__cxx11::string::string((string *)&local_8a0,"bern_hyper",&local_985);
  VW::config::typed_option<float>::typed_option
            (&local_2a8,&local_8a0,
             &(local_9a0._M_t.super___uniq_ptr_impl<recall_tree_ns::recall_tree,_void_(*)(void_*)>.
               _M_t.super__Tuple_impl<0UL,_recall_tree_ns::recall_tree_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_recall_tree_ns::recall_tree_*,_false>._M_head_impl)->bern_hyper
            );
  ptVar5 = VW::config::typed_option<float>::default_value(&local_2a8,1.0);
  std::__cxx11::string::string(local_8c0,"recall tree depth penalty",&local_986);
  std::__cxx11::string::_M_assign((string *)&(ptVar5->super_base_option).m_help);
  VW::config::typed_option<float>::typed_option(&local_208,ptVar5);
  poVar4 = VW::config::option_group_definition::add<float>(poVar4,&local_208);
  std::__cxx11::string::string((string *)&local_8e0,"max_depth",&local_987);
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)local_528,&local_8e0,
             &(local_9a0._M_t.super___uniq_ptr_impl<recall_tree_ns::recall_tree,_void_(*)(void_*)>.
               _M_t.super__Tuple_impl<0UL,_recall_tree_ns::recall_tree_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_recall_tree_ns::recall_tree_*,_false>._M_head_impl)->max_depth)
  ;
  local_4b8 = true;
  std::__cxx11::string::string
            (local_900,"maximum depth of the tree, default log_2 (#classes)",&local_988);
  std::__cxx11::string::_M_assign((string *)(local_528 + 0x30));
  VW::config::typed_option<unsigned_long>::typed_option
            (&local_348,(typed_option<unsigned_long> *)local_528);
  poVar4 = VW::config::option_group_definition::add<unsigned_long>(poVar4,&local_348);
  std::__cxx11::string::string((string *)&local_920,"node_only",&local_989);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_5c8,&local_920,
             &(local_9a0._M_t.super___uniq_ptr_impl<recall_tree_ns::recall_tree,_void_(*)(void_*)>.
               _M_t.super__Tuple_impl<0UL,_recall_tree_ns::recall_tree_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_recall_tree_ns::recall_tree_*,_false>._M_head_impl)->node_only)
  ;
  local_558 = true;
  std::__cxx11::string::string
            (local_940,"only use node features, not full path features",&local_98a);
  std::__cxx11::string::_M_assign((string *)(local_5c8 + 0x30));
  VW::config::typed_option<bool>::typed_option(&local_3e8,(typed_option<bool> *)local_5c8);
  poVar4 = VW::config::option_group_definition::add<bool>(poVar4,&local_3e8);
  std::__cxx11::string::string((string *)&local_960,"randomized_routing",&local_98b);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_668,&local_960,
             &(local_9a0._M_t.super___uniq_ptr_impl<recall_tree_ns::recall_tree,_void_(*)(void_*)>.
               _M_t.super__Tuple_impl<0UL,_recall_tree_ns::recall_tree_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_recall_tree_ns::recall_tree_*,_false>._M_head_impl)->
              randomized_routing);
  local_5f8 = true;
  std::__cxx11::string::string(local_980,"randomized routing",&local_98c);
  std::__cxx11::string::_M_assign((string *)(local_668 + 0x30));
  VW::config::typed_option<bool>::typed_option(&local_488,(typed_option<bool> *)local_668);
  VW::config::option_group_definition::add<bool>(poVar4,&local_488);
  VW::config::typed_option<bool>::~typed_option(&local_488);
  std::__cxx11::string::~string(local_980);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)local_668);
  std::__cxx11::string::~string((string *)&local_960);
  VW::config::typed_option<bool>::~typed_option(&local_3e8);
  std::__cxx11::string::~string(local_940);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)local_5c8);
  std::__cxx11::string::~string((string *)&local_920);
  VW::config::typed_option<unsigned_long>::~typed_option(&local_348);
  std::__cxx11::string::~string(local_900);
  VW::config::typed_option<unsigned_long>::~typed_option((typed_option<unsigned_long> *)local_528);
  std::__cxx11::string::~string((string *)&local_8e0);
  VW::config::typed_option<float>::~typed_option(&local_208);
  std::__cxx11::string::~string(local_8c0);
  VW::config::typed_option<float>::~typed_option(&local_2a8);
  std::__cxx11::string::~string((string *)&local_8a0);
  VW::config::typed_option<unsigned_long>::~typed_option(&local_168);
  std::__cxx11::string::~string(local_880);
  VW::config::typed_option<unsigned_long>::~typed_option((typed_option<unsigned_long> *)local_708);
  std::__cxx11::string::~string((string *)&local_860);
  VW::config::typed_option<unsigned_int>::~typed_option(&local_c8);
  std::__cxx11::string::~string(local_840);
  VW::config::typed_option<unsigned_int>::~typed_option((typed_option<unsigned_int> *)local_7e0);
  std::__cxx11::string::~string((string *)&local_820);
  (**options->_vptr_options_i)(options,&local_740);
  std::__cxx11::string::string((string *)local_7e0,"recall_tree",(allocator *)local_708);
  iVar2 = (*options->_vptr_options_i[1])(options,local_7e0);
  std::__cxx11::string::~string((string *)local_7e0);
  if ((char)iVar2 == '\0') {
    plVar8 = (learner<recall_tree_ns::recall_tree,_example> *)0x0;
  }
  else {
    (local_9a0._M_t.super___uniq_ptr_impl<recall_tree_ns::recall_tree,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_recall_tree_ns::recall_tree_*,_void_(*)(void_*)>.
     super__Head_base<0UL,_recall_tree_ns::recall_tree_*,_false>._M_head_impl)->all = all;
    std::__cxx11::string::string((string *)local_7e0,"max_candidates",(allocator *)local_708);
    iVar2 = (*options->_vptr_options_i[1])(options,local_7e0);
    _Var1._M_head_impl =
         local_9a0._M_t.super___uniq_ptr_impl<recall_tree_ns::recall_tree,_void_(*)(void_*)>._M_t.
         super__Tuple_impl<0UL,_recall_tree_ns::recall_tree_*,_void_(*)(void_*)>.
         super__Head_base<0UL,_recall_tree_ns::recall_tree_*,_false>._M_head_impl;
    if ((char)iVar2 == '\0') {
      _Var10 = std::log<unsigned_int>
                         ((local_9a0._M_t.
                           super___uniq_ptr_impl<recall_tree_ns::recall_tree,_void_(*)(void_*)>._M_t
                           .super__Tuple_impl<0UL,_recall_tree_ns::recall_tree_*,_void_(*)(void_*)>.
                           super__Head_base<0UL,_recall_tree_ns::recall_tree_*,_false>._M_head_impl)
                          ->k);
      dVar11 = ceil(_Var10 / 0.6931471805599453);
      uVar3 = (int)(long)dVar11 << 2;
      if ((_Var1._M_head_impl)->k <= uVar3) {
        uVar3 = (_Var1._M_head_impl)->k;
      }
      uVar6 = (ulong)uVar3;
    }
    else {
      uVar6 = (local_9a0._M_t.super___uniq_ptr_impl<recall_tree_ns::recall_tree,_void_(*)(void_*)>.
               _M_t.super__Tuple_impl<0UL,_recall_tree_ns::recall_tree_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_recall_tree_ns::recall_tree_*,_false>._M_head_impl)->
              max_candidates;
    }
    (local_9a0._M_t.super___uniq_ptr_impl<recall_tree_ns::recall_tree,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_recall_tree_ns::recall_tree_*,_void_(*)(void_*)>.
     super__Head_base<0UL,_recall_tree_ns::recall_tree_*,_false>._M_head_impl)->max_candidates =
         uVar6;
    std::__cxx11::string::~string((string *)local_7e0);
    std::__cxx11::string::string((string *)local_7e0,"max_depth",(allocator *)local_708);
    iVar2 = (*options->_vptr_options_i[1])(options,local_7e0);
    if ((char)iVar2 == '\0') {
      _Var10 = std::log<unsigned_int>
                         ((local_9a0._M_t.
                           super___uniq_ptr_impl<recall_tree_ns::recall_tree,_void_(*)(void_*)>._M_t
                           .super__Tuple_impl<0UL,_recall_tree_ns::recall_tree_*,_void_(*)(void_*)>.
                           super__Head_base<0UL,_recall_tree_ns::recall_tree_*,_false>._M_head_impl)
                          ->k);
      dVar11 = ceil(_Var10 / 0.6931471805599453);
      uVar6 = (long)dVar11 & 0xffffffff;
    }
    else {
      uVar6 = (local_9a0._M_t.super___uniq_ptr_impl<recall_tree_ns::recall_tree,_void_(*)(void_*)>.
               _M_t.super__Tuple_impl<0UL,_recall_tree_ns::recall_tree_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_recall_tree_ns::recall_tree_*,_false>._M_head_impl)->max_depth;
    }
    (local_9a0._M_t.super___uniq_ptr_impl<recall_tree_ns::recall_tree,_void_(*)(void_*)>._M_t.
     super__Tuple_impl<0UL,_recall_tree_ns::recall_tree_*,_void_(*)(void_*)>.
     super__Head_base<0UL,_recall_tree_ns::recall_tree_*,_false>._M_head_impl)->max_depth = uVar6;
    std::__cxx11::string::~string((string *)local_7e0);
    recall_tree_ns::init_tree
              (local_9a0._M_t.super___uniq_ptr_impl<recall_tree_ns::recall_tree,_void_(*)(void_*)>.
               _M_t.super__Tuple_impl<0UL,_recall_tree_ns::recall_tree_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_recall_tree_ns::recall_tree_*,_false>._M_head_impl);
    if (all->quiet == false) {
      poVar7 = std::operator<<(&(all->trace_message).super_ostream,"recall_tree:");
      poVar7 = std::operator<<(poVar7," node_only = ");
      poVar7 = std::ostream::_M_insert<bool>(SUB81(poVar7,0));
      poVar7 = std::operator<<(poVar7," bern_hyper = ");
      poVar7 = (ostream *)
               std::ostream::operator<<
                         (poVar7,(local_9a0._M_t.
                                  super___uniq_ptr_impl<recall_tree_ns::recall_tree,_void_(*)(void_*)>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_recall_tree_ns::recall_tree_*,_void_(*)(void_*)>
                                  .super__Head_base<0UL,_recall_tree_ns::recall_tree_*,_false>.
                                 _M_head_impl)->bern_hyper);
      poVar7 = std::operator<<(poVar7," max_depth = ");
      poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
      poVar7 = std::operator<<(poVar7," routing = ");
      if (all->training == true) {
        pcVar9 = "deterministic";
        if ((local_9a0._M_t.super___uniq_ptr_impl<recall_tree_ns::recall_tree,_void_(*)(void_*)>.
             _M_t.super__Tuple_impl<0UL,_recall_tree_ns::recall_tree_*,_void_(*)(void_*)>.
             super__Head_base<0UL,_recall_tree_ns::recall_tree_*,_false>._M_head_impl)->
            randomized_routing != false) {
          pcVar9 = "randomized";
        }
      }
      else {
        pcVar9 = "n/a testonly";
      }
      poVar7 = std::operator<<(poVar7,pcVar9);
      std::endl<char,std::char_traits<char>>(poVar7);
    }
    l = setup_base(options,all);
    base = LEARNER::as_singleline<char,char>(l);
    plVar8 = LEARNER::
             init_multiclass_learner<recall_tree_ns::recall_tree,example,LEARNER::learner<char,example>>
                       (&local_9a0,base,recall_tree_ns::learn,recall_tree_ns::predict,all->p,
                        (ulong)(local_9a0._M_t.
                                super___uniq_ptr_impl<recall_tree_ns::recall_tree,_void_(*)(void_*)>
                                ._M_t.
                                super__Tuple_impl<0UL,_recall_tree_ns::recall_tree_*,_void_(*)(void_*)>
                                .super__Head_base<0UL,_recall_tree_ns::recall_tree_*,_false>.
                               _M_head_impl)->k +
                        (local_9a0._M_t.
                         super___uniq_ptr_impl<recall_tree_ns::recall_tree,_void_(*)(void_*)>._M_t.
                         super__Tuple_impl<0UL,_recall_tree_ns::recall_tree_*,_void_(*)(void_*)>.
                         super__Head_base<0UL,_recall_tree_ns::recall_tree_*,_false>._M_head_impl)->
                        max_routers,multiclass);
    *(code **)(plVar8 + 0x80) = recall_tree_ns::save_load_tree;
    *(undefined8 *)(plVar8 + 0x70) = *(undefined8 *)(plVar8 + 0x18);
    *(undefined8 *)(plVar8 + 0x78) = *(undefined8 *)(plVar8 + 0x20);
    *(undefined8 *)(plVar8 + 0xb8) = *(undefined8 *)(plVar8 + 0x18);
    *(undefined8 *)(plVar8 + 0xc0) = *(undefined8 *)(plVar8 + 0x20);
    *(code **)(plVar8 + 200) = recall_tree_ns::finish;
  }
  VW::config::option_group_definition::~option_group_definition(&local_740);
  std::unique_ptr<recall_tree_ns::recall_tree,_void_(*)(void_*)>::~unique_ptr(&local_9a0);
  return (base_learner *)plVar8;
}

Assistant:

base_learner* recall_tree_setup(options_i& options, vw& all)
{
  auto tree = scoped_calloc_or_throw<recall_tree>();
  option_group_definition new_options("Recall Tree");
  new_options.add(make_option("recall_tree", tree->k).keep().help("Use online tree for multiclass"))
      .add(make_option("max_candidates", tree->max_candidates)
               .keep()
               .help("maximum number of labels per leaf in the tree"))
      .add(make_option("bern_hyper", tree->bern_hyper).default_value(1.f).help("recall tree depth penalty"))
      .add(make_option("max_depth", tree->max_depth).keep().help("maximum depth of the tree, default log_2 (#classes)"))
      .add(make_option("node_only", tree->node_only).keep().help("only use node features, not full path features"))
      .add(make_option("randomized_routing", tree->randomized_routing).keep().help("randomized routing"));
  options.add_and_parse(new_options);

  if (!options.was_supplied("recall_tree"))
    return nullptr;

  tree->all = &all;
  tree->max_candidates = options.was_supplied("max_candidates")
      ? tree->max_candidates
      : (std::min)(tree->k, 4 * (uint32_t)(ceil(log(tree->k) / log(2.0))));
  tree->max_depth =
      options.was_supplied("max_depth") ? tree->max_depth : (uint32_t)std::ceil(std::log(tree->k) / std::log(2.0));

  init_tree(*tree.get());

  if (!all.quiet)
    all.trace_message << "recall_tree:"
                      << " node_only = " << tree->node_only << " bern_hyper = " << tree->bern_hyper
                      << " max_depth = " << tree->max_depth << " routing = "
                      << (all.training ? (tree->randomized_routing ? "randomized" : "deterministic") : "n/a testonly")
                      << std::endl;

  learner<recall_tree, example>& l = init_multiclass_learner(
      tree, as_singleline(setup_base(options, all)), learn, predict, all.p, tree->max_routers + tree->k);
  l.set_save_load(save_load_tree);
  l.set_finish(finish);

  return make_base(l);
}